

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_socket.hpp
# Opt level: O2

bool __thiscall iutest::detail::BasicSocket::Open(BasicSocket *this,char *host,char *port)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  addrinfo **__pai;
  bool bVar4;
  addrinfo *servinfo;
  addrinfo hints;
  addrinfo *local_50;
  addrinfo local_48;
  
  if (this->m_socket != -1) {
    return true;
  }
  __pai = &local_50;
  local_50 = (addrinfo *)0x0;
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  iVar2 = getaddrinfo(host,port,&local_48,__pai);
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      if (iVar2 != -1) {
        iVar3 = connect(iVar2,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar3 != -1) {
          this->m_socket = iVar2;
          break;
        }
        close(iVar2);
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo(local_50);
    bVar4 = this->m_socket != -1;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Open(const char* host, const char* port)
    {
        if( m_socket != INVALID_DESCRIPTOR )
        {
            return true;
        }
        addrinfo* servinfo = NULL;
        addrinfo hints;
        memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_STREAM;
        const int err_no = getaddrinfo(host, port, &hints, &servinfo);
        if( err_no != 0 )
        {
            return false;
        }

        for( addrinfo* curr=servinfo; curr != NULL; curr = curr->ai_next )
        {
            const descriptor_t fd = socket(curr->ai_family, curr->ai_socktype, curr->ai_protocol);
            if( fd != INVALID_DESCRIPTOR )
            {
                if( connect(fd, curr->ai_addr, static_cast<length_t>(curr->ai_addrlen)) != -1 )
                {
                    m_socket = fd;
                    break;
                }
                Close(fd);
            }
        }
        freeaddrinfo(servinfo);
        return (m_socket != INVALID_DESCRIPTOR);
    }